

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O2

PipelineClassifier * __thiscall
CoreML::Specification::Model::mutable_pipelineclassifier(Model *this)

{
  PipelineClassifier *this_00;
  
  if (this->_oneof_case_[0] == 200) {
    this_00 = (this->Type_).pipelineclassifier_;
  }
  else {
    clear_Type(this);
    this->_oneof_case_[0] = 200;
    this_00 = (PipelineClassifier *)operator_new(0x20);
    PipelineClassifier::PipelineClassifier(this_00);
    (this->Type_).pipelineclassifier_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::PipelineClassifier* Model::mutable_pipelineclassifier() {
  if (!has_pipelineclassifier()) {
    clear_Type();
    set_has_pipelineclassifier();
    Type_.pipelineclassifier_ = new ::CoreML::Specification::PipelineClassifier;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.pipelineClassifier)
  return Type_.pipelineclassifier_;
}